

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

void __thiscall
chaiscript::AST_Node::AST_Node
          (AST_Node *this,string *t_ast_node_text,AST_Node_Type t_id,Parse_Location *t_loc)

{
  Parse_Location *t_loc_local;
  AST_Node_Type t_id_local;
  string *t_ast_node_text_local;
  AST_Node *this_local;
  
  this->_vptr_AST_Node = (_func_int **)&PTR___cxa_pure_virtual_0082b028;
  this->identifier = t_id;
  std::__cxx11::string::string((string *)&this->text,t_ast_node_text);
  Parse_Location::Parse_Location(&this->location,t_loc);
  return;
}

Assistant:

AST_Node(std::string t_ast_node_text, AST_Node_Type t_id, Parse_Location t_loc)
        : identifier(t_id)
        , text(std::move(t_ast_node_text))
        , location(std::move(t_loc)) {
    }